

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Nsfe_File::load_(Nsfe_File *this,Data_Reader *in)

{
  byte bVar1;
  uint uVar2;
  blargg_err_t pcVar3;
  
  pcVar3 = Nsfe_Info::load(&this->info,in,(Nsf_Emu *)0x0);
  if (pcVar3 == (blargg_err_t)0x0) {
    (this->info).playlist_disabled = false;
    bVar1 = (byte)(this->info).playlist.size_;
    (this->info).info.super_header_t.track_count = bVar1;
    if (bVar1 == '\0') {
      (this->info).info.super_header_t.track_count = (byte)(this->info).actual_track_count_;
    }
    uVar2 = (uint)(this->info).info.super_header_t.track_count;
    (this->super_Gme_Info_).super_Music_Emu.super_Gme_File.raw_track_count_ = uVar2;
    (this->super_Gme_Info_).super_Music_Emu.super_Gme_File.track_count_ = uVar2;
    pcVar3 = (blargg_err_t)0x0;
  }
  return pcVar3;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		RETURN_ERR( info.load( in, 0 ) );
		info.disable_playlist( false );
		set_track_count( info.info.track_count );
		return 0;
	}